

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fperror.h
# Opt level: O1

FPError * __thiscall
phyr::FPError::operator*(FPError *__return_storage_ptr__,FPError *this,FPError *fp)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  
  auVar3._0_8_ = fp->lBound * this->lBound;
  auVar3._8_8_ = fp->lBound * this->uBound;
  auVar2._0_8_ = fp->uBound * this->lBound;
  auVar2._8_8_ = fp->uBound * this->uBound;
  auVar4._8_8_ = auVar2._8_8_;
  auVar4._0_8_ = auVar2._0_8_;
  auVar4 = minpd(auVar4,auVar3);
  dVar1 = auVar4._8_8_;
  if (auVar4._0_8_ <= auVar4._8_8_) {
    dVar1 = auVar4._0_8_;
  }
  if (-INFINITY < dVar1) {
    dVar1 = (double)(~-(ulong)(dVar1 == 0.0) & (ulong)dVar1 |
                    -(ulong)(dVar1 == 0.0) & 0x8000000000000000);
    dVar1 = (double)((long)dVar1 + (ulong)(dVar1 <= 0.0) * 2 + -1);
  }
  auVar3 = maxpd(auVar2,auVar3);
  dVar5 = auVar3._8_8_;
  if (auVar3._8_8_ <= auVar3._0_8_) {
    dVar5 = auVar3._0_8_;
  }
  if (dVar5 < INFINITY) {
    dVar5 = (double)(~-(ulong)(dVar5 == 0.0) & (ulong)dVar5);
    dVar5 = (double)((-(ulong)(dVar5 < 0.0) | 1) + (long)dVar5);
  }
  __return_storage_ptr__->v = this->v * fp->v;
  __return_storage_ptr__->lBound = dVar1;
  __return_storage_ptr__->uBound = dVar5;
  return __return_storage_ptr__;
}

Assistant:

FPError operator*(const FPError& fp) const {
        Real _b[4] = {
            lBound * fp.lBound, lBound * fp.uBound,
            uBound * fp.lBound, uBound * fp.uBound
        };

        return FPError(v * fp.v,
                       nextFloatDown(std::min(std::min(_b[0], _b[1]), std::min(_b[2], _b[3]))),
                       nextFloatUp(std::max(std::max(_b[0], _b[1]), std::max(_b[2], _b[3]))));
    }